

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsurveyor.c
# Opt level: O0

int nn_xsurveyor_events(nn_sockbase *self)

{
  int iVar1;
  int events;
  nn_xsurveyor *xsurveyor;
  int local_14;
  
  local_14 = 2;
  iVar1 = nn_fq_can_recv((nn_fq *)0x1de376);
  if (iVar1 != 0) {
    local_14 = 3;
  }
  return local_14;
}

Assistant:

int nn_xsurveyor_events (struct nn_sockbase *self)
{
    struct nn_xsurveyor *xsurveyor;
    int events;

    xsurveyor = nn_cont (self, struct nn_xsurveyor, sockbase);

    events = NN_SOCKBASE_EVENT_OUT;
    if (nn_fq_can_recv (&xsurveyor->inpipes))
        events |= NN_SOCKBASE_EVENT_IN;
    return events;
}